

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlDate.cpp
# Opt level: O3

filepos_t __thiscall
libebml::EbmlDate::RenderData(EbmlDate *this,IOCallback *output,bool param_2,bool param_3)

{
  undefined1 uVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar3;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined7 in_register_00000009;
  undefined1 *puVar4;
  undefined7 in_register_00000011;
  big_int64 b64;
  int64 local_28;
  undefined8 local_20;
  
  iVar2 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])
                    (this,output,CONCAT71(in_register_00000011,param_2),
                     CONCAT71(in_register_00000009,param_3));
  if (CONCAT44(extraout_var,iVar2) != 0) {
    iVar2 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])(this);
    if (CONCAT44(extraout_var_00,iVar2) != 8) {
      __assert_fail("GetSize() == 8",
                    "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/ebml/src/EbmlDate.cpp"
                    ,0x45,
                    "virtual filepos_t libebml::EbmlDate::RenderData(IOCallback &, bool, bool)");
    }
    local_28 = this->myDate;
    local_20 = local_28;
    lVar3 = 8;
    puVar4 = (undefined1 *)((long)&local_20 + 7);
    do {
      uVar1 = *(undefined1 *)((long)&local_28 + lVar3);
      *(undefined1 *)((long)&local_28 + lVar3) = *puVar4;
      *puVar4 = uVar1;
      lVar3 = lVar3 + 1;
      puVar4 = puVar4 + -1;
    } while (lVar3 != 0xc);
    iVar2 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])(this);
    IOCallback::writeFully(output,&local_20,CONCAT44(extraout_var_01,iVar2));
  }
  iVar2 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])(this);
  return CONCAT44(extraout_var_02,iVar2);
}

Assistant:

filepos_t EbmlDate::RenderData(IOCallback & output, bool /* bForceRender */, bool  /* bWithDefault */)
{
  if (GetSize() != 0) {
    assert(GetSize() == 8);
    big_int64 b64(myDate);

    output.writeFully(&b64.endian(),GetSize());
  }

  return GetSize();
}